

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O1

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval_quad(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
            *this,vboolf_impl<4> *valid,SubdividedQuadPatch *This,vfloat_impl<4> *u,
           vfloat_impl<4> *v,float dscale,size_t depth)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  vboolf_impl<4> vVar13;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar14;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar15;
  vboolf_impl<4> u1v1_mask;
  vboolf_impl<4> u1v0_mask;
  vboolf_impl<4> u0v1_mask;
  vboolf_impl<4> u0v0_mask;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_a8;
  PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_98;
  ulong local_58;
  ulong uStack_50;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  uVar9 = mm_lookupmask_ps._8_8_;
  uVar12 = mm_lookupmask_ps._0_8_;
  this->P = (float *)mm_lookupmask_ps._0_8_;
  this->dPdu = (float *)uVar9;
  fVar2 = (v->field_0).v[0];
  fVar3 = (v->field_0).v[1];
  fVar4 = (v->field_0).v[2];
  fVar5 = (v->field_0).v[3];
  local_b8 = *(float *)depth;
  fStack_b4 = *(float *)(depth + 4);
  fStack_b0 = *(float *)(depth + 8);
  fStack_ac = *(float *)(depth + 0xc);
  local_98.dPdv._0_4_ = (uint)This->child[0].ptr;
  local_98.dPdv._4_4_ = *(uint *)((long)&This->child[0].ptr + 4);
  local_98.ddPdudu._0_4_ = (uint)This->child[1].ptr;
  local_98.ddPdudu._4_4_ = *(uint *)((long)&This->child[1].ptr + 4);
  local_98.dstride._0_4_ = -(uint)(fVar2 < 0.5) & (uint)local_98.dPdv;
  local_98.dstride._4_4_ = -(uint)(fVar3 < 0.5) & local_98.dPdv._4_4_;
  local_98.N._0_4_ = -(uint)(fVar4 < 0.5) & (uint)local_98.ddPdudu;
  local_98.N._4_4_ = -(uint)(fVar5 < 0.5) & local_98.ddPdudu._4_4_;
  local_48 = -(uint)(local_b8 < 0.5) & (uint)local_98.dstride;
  uStack_44 = -(uint)(fStack_b4 < 0.5) & local_98.dstride._4_4_;
  uStack_40 = -(uint)(fStack_b0 < 0.5) & (uint)local_98.N;
  uStack_3c = -(uint)(fStack_ac < 0.5) & local_98.N._4_4_;
  local_98.dstride._0_4_ = (uint)local_98.dstride & -(uint)(0.5 <= local_b8);
  local_98.dstride._4_4_ = local_98.dstride._4_4_ & -(uint)(0.5 <= fStack_b4);
  local_98.N._0_4_ = (uint)local_98.N & -(uint)(0.5 <= fStack_b0);
  local_98.N._4_4_ = local_98.N._4_4_ & -(uint)(0.5 <= fStack_ac);
  local_98.dPdv._0_4_ = -(uint)(0.5 <= fVar2) & (uint)local_98.dPdv;
  local_98.dPdv._4_4_ = -(uint)(0.5 <= fVar3) & local_98.dPdv._4_4_;
  local_98.ddPdudu._0_4_ = -(uint)(0.5 <= fVar4) & (uint)local_98.ddPdudu;
  local_98.ddPdudu._4_4_ = -(uint)(0.5 <= fVar5) & local_98.ddPdudu._4_4_;
  local_98.ddPdvdv._0_4_ = -(uint)(local_b8 < 0.5) & (uint)local_98.dPdv;
  local_98.ddPdvdv._4_4_ = -(uint)(fStack_b4 < 0.5) & local_98.dPdv._4_4_;
  local_98.ddPdudv._0_4_ = -(uint)(fStack_b0 < 0.5) & (uint)local_98.ddPdudu;
  local_98.ddPdudv._4_4_ = -(uint)(fStack_ac < 0.5) & local_98.ddPdudu._4_4_;
  local_98.dPdv._0_4_ = (uint)local_98.dPdv & -(uint)(0.5 <= local_b8);
  local_98.dPdv._4_4_ = local_98.dPdv._4_4_ & -(uint)(0.5 <= fStack_b4);
  local_98.ddPdudu._0_4_ = (uint)local_98.ddPdudu & -(uint)(0.5 <= fStack_b0);
  local_98.ddPdudu._4_4_ = local_98.ddPdudu._4_4_ & -(uint)(0.5 <= fStack_ac);
  auVar1._4_4_ = uStack_44;
  auVar1._0_4_ = local_48;
  auVar1._8_4_ = uStack_40;
  auVar1._12_4_ = uStack_3c;
  iVar10 = movmskps(0x224ff80,auVar1);
  if (iVar10 != 0) {
    local_a8.v[0] = fVar2 + fVar2;
    local_a8.v[1] = fVar3 + fVar3;
    local_a8.v[2] = fVar4 + fVar4;
    local_a8.v[3] = fVar5 + fVar5;
    local_b8 = local_b8 + local_b8;
    fStack_b4 = fStack_b4 + fStack_b4;
    fStack_b0 = fStack_b0 + fStack_b0;
    fStack_ac = fStack_ac + fStack_ac;
    local_58 = uVar12;
    uStack_50 = uVar9;
    vVar13 = eval(&local_98,valid,(Ref)&local_48,*(vfloat_impl<4> **)&u->field_0,
                  (vfloat_impl<4> *)&local_a8,dscale + dscale,(size_t)&local_b8);
    This = vVar13.field_0._8_8_;
    iVar10 = vVar13.field_0._0_4_;
    this->P = (float *)(local_58 | (ulong)local_98.P);
    this->dPdu = (float *)(uStack_50 | (ulong)local_98.dPdu);
  }
  auVar7._4_4_ = local_98.ddPdvdv._4_4_;
  auVar7._0_4_ = (uint)local_98.ddPdvdv;
  auVar7._8_4_ = (uint)local_98.ddPdudv;
  auVar7._12_4_ = local_98.ddPdudv._4_4_;
  uVar11 = movmskps(iVar10,auVar7);
  aVar14.v[1] = 0.0;
  aVar14.i[0] = uVar11;
  aVar14._8_8_ = This;
  if (uVar11 != 0) {
    local_a8.v[0] = (v->field_0).v[0] + (v->field_0).v[0] + -1.0;
    local_a8.v[1] = (v->field_0).v[1] + (v->field_0).v[1] + -1.0;
    local_a8.v[2] = (v->field_0).v[2] + (v->field_0).v[2] + -1.0;
    local_a8.v[3] = (v->field_0).v[3] + (v->field_0).v[3] + -1.0;
    local_b8 = *(float *)depth + *(float *)depth;
    fStack_b4 = *(float *)(depth + 4) + *(float *)(depth + 4);
    fStack_b0 = *(float *)(depth + 8) + *(float *)(depth + 8);
    fStack_ac = *(float *)(depth + 0xc) + *(float *)(depth + 0xc);
    aVar14 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
             eval(&local_98,valid,(Ref)&local_98.ddPdvdv,*(vfloat_impl<4> **)((long)&u->field_0 + 8)
                  ,(vfloat_impl<4> *)&local_a8,dscale + dscale,(size_t)&local_b8);
    this->P = (float *)((ulong)local_98.P | (ulong)this->P);
    this->dPdu = (float *)((ulong)local_98.dPdu | (ulong)this->dPdu);
  }
  auVar6._4_4_ = local_98.dPdv._4_4_;
  auVar6._0_4_ = (uint)local_98.dPdv;
  auVar6._8_4_ = (uint)local_98.ddPdudu;
  auVar6._12_4_ = local_98.ddPdudu._4_4_;
  uVar11 = movmskps(aVar14.v[0],auVar6);
  aVar15.v[1] = 0.0;
  aVar15.i[0] = uVar11;
  aVar15._8_8_ = aVar14._8_8_;
  if (uVar11 != 0) {
    local_a8.v[0] = (v->field_0).v[0] + (v->field_0).v[0] + -1.0;
    local_a8.v[1] = (v->field_0).v[1] + (v->field_0).v[1] + -1.0;
    local_a8.v[2] = (v->field_0).v[2] + (v->field_0).v[2] + -1.0;
    local_a8.v[3] = (v->field_0).v[3] + (v->field_0).v[3] + -1.0;
    local_b8 = *(float *)depth + *(float *)depth + -1.0;
    fStack_b4 = *(float *)(depth + 4) + *(float *)(depth + 4) + -1.0;
    fStack_b0 = *(float *)(depth + 8) + *(float *)(depth + 8) + -1.0;
    fStack_ac = *(float *)(depth + 0xc) + *(float *)(depth + 0xc) + -1.0;
    aVar15 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
             eval(&local_98,valid,(Ref)&local_98.dPdv,*(vfloat_impl<4> **)&u[1].field_0,
                  (vfloat_impl<4> *)&local_a8,dscale + dscale,(size_t)&local_b8);
    this->P = (float *)((ulong)local_98.P | (ulong)this->P);
    this->dPdu = (float *)((ulong)local_98.dPdu | (ulong)this->dPdu);
  }
  uVar12 = aVar15._8_8_;
  auVar8._4_4_ = local_98.dstride._4_4_;
  auVar8._0_4_ = (uint)local_98.dstride;
  auVar8._8_4_ = (uint)local_98.N;
  auVar8._12_4_ = local_98.N._4_4_;
  iVar10 = movmskps(aVar15.v[0],auVar8);
  if (iVar10 != 0) {
    local_a8.v[0] = (v->field_0).v[0] + (v->field_0).v[0];
    local_a8.v[1] = (v->field_0).v[1] + (v->field_0).v[1];
    local_a8.v[2] = (v->field_0).v[2] + (v->field_0).v[2];
    local_a8.v[3] = (v->field_0).v[3] + (v->field_0).v[3];
    local_b8 = *(float *)depth + *(float *)depth + -1.0;
    fStack_b4 = *(float *)(depth + 4) + *(float *)(depth + 4) + -1.0;
    fStack_b0 = *(float *)(depth + 8) + *(float *)(depth + 8) + -1.0;
    fStack_ac = *(float *)(depth + 0xc) + *(float *)(depth + 0xc) + -1.0;
    vVar13 = eval(&local_98,valid,(Ref)&local_98.dstride,
                  *(vfloat_impl<4> **)((long)&u[1].field_0 + 8),(vfloat_impl<4> *)&local_a8,
                  dscale + dscale,(size_t)&local_b8);
    uVar12 = vVar13.field_0._8_8_;
    this->P = (float *)((ulong)local_98.P | (ulong)this->P);
    this->dPdu = (float *)((ulong)local_98.dPdu | (ulong)this->dPdu);
  }
  vVar13.field_0._8_8_ = uVar12;
  vVar13.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar13.field_0;
}

Assistant:

vbool eval_quad(const vbool& valid, const typename Patch::SubdividedQuadPatch* This, const vfloat& u, const vfloat& v, const float dscale, const size_t depth)
        {
          vbool ret = false;
          const vbool u0_mask = u < 0.5f, u1_mask = u >= 0.5f;
          const vbool v0_mask = v < 0.5f, v1_mask = v >= 0.5f;
          const vbool u0v0_mask = valid & u0_mask & v0_mask;
          const vbool u0v1_mask = valid & u0_mask & v1_mask;
          const vbool u1v0_mask = valid & u1_mask & v0_mask;
          const vbool u1v1_mask = valid & u1_mask & v1_mask;
          if (any(u0v0_mask)) ret |= eval(u0v0_mask,This->child[0],2.0f*u,2.0f*v,2.0f*dscale,depth+1);
          if (any(u1v0_mask)) ret |= eval(u1v0_mask,This->child[1],2.0f*u-1.0f,2.0f*v,2.0f*dscale,depth+1);
          if (any(u1v1_mask)) ret |= eval(u1v1_mask,This->child[2],2.0f*u-1.0f,2.0f*v-1.0f,2.0f*dscale,depth+1);
          if (any(u0v1_mask)) ret |= eval(u0v1_mask,This->child[3],2.0f*u,2.0f*v-1.0f,2.0f*dscale,depth+1);
          return ret;
        }